

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAA_ELSI.cpp
# Opt level: O2

void __thiscall
GMAA_MAA_ELSI::Fill_FirstOHtsI
          (GMAA_MAA_ELSI *this,Index ts,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *firstOHtsI)

{
  int iVar1;
  Index IVar2;
  undefined8 in_RAX;
  undefined4 extraout_var;
  LIndex i;
  Index agI;
  ulong uVar3;
  Index fI;
  undefined8 uStack_38;
  
  uVar3 = 0;
  uStack_38 = in_RAX;
  while( true ) {
    iVar1 = (*(this->super_GeneralizedMAAStarPlannerForFactoredDecPOMDPDiscrete).
              super_PlanningUnitFactoredDecPOMDPDiscrete.super_PlanningUnitDecPOMDPDiscrete.
              super_PlanningUnitMADPDiscrete.super_PlanningUnit._vptr_PlanningUnit[6])(this);
    if (CONCAT44(extraout_var,iVar1) <= uVar3) break;
    i = PlanningUnitMADPDiscrete::GetFirstObservationHistoryIndex
                  ((PlanningUnitMADPDiscrete *)this,(Index)uVar3,ts);
    IVar2 = Globals::CastLIndexToIndex(i);
    uStack_38 = CONCAT44(IVar2,(undefined4)uStack_38);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (firstOHtsI,(value_type_conflict1 *)((long)&uStack_38 + 4));
    uVar3 = (ulong)((Index)uVar3 + 1);
  }
  return;
}

Assistant:

void  GMAA_MAA_ELSI::Fill_FirstOHtsI(Index ts, 
        vector<Index>& firstOHtsI)
{
    //because the OHs are constructed breath-first, we know the OHs for agent i
    //for this time step are numbered:
    //firstOHtsGI[i]...firstOHtsGI[i]+nrOH[i]-1
    //
    //(read first-OH-for-time-step-ts its Global Index)
    //
    //i.e. ohGI = ohI + firstOHtsGI 

    for(Index agI=0; agI < GetNrAgents(); agI++)
    {
        Index fI = CastLIndexToIndex(GetFirstObservationHistoryIndex(agI, ts));
        firstOHtsI.push_back(fI); 
    }
}